

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O2

S2CellId __thiscall S2PaddedCell::ShrinkToFit(S2PaddedCell *this,R2Rect *rect)

{
  bool bVar1;
  uint uVar2;
  S2CellId SVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  int ij_xor [2];
  int ij_min [2];
  S2CellId local_58;
  R2Rect padded;
  
  bVar1 = R2Rect::Intersects(&this->bound_,rect);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&padded,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2padded_cell.cc"
               ,0x7b,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)padded.bounds_[0].bounds_.c_[1],
                    "Check failed: bound().Intersects(rect) ");
    abort();
  }
  iVar7 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  if (this->level_ == 0) {
    if (((rect->bounds_[0].bounds_.c_[0] <= 0.0) && (0.0 <= rect->bounds_[0].bounds_.c_[1])) ||
       ((rect->bounds_[1].bounds_.c_[0] <= 0.0 && (0.0 <= rect->bounds_[1].bounds_.c_[1]))))
    goto LAB_0024292b;
  }
  else {
    dVar8 = S2::SiTitoST(iVar7 + this->ij_lo_[0] * 2);
    dVar8 = S2::STtoUV(dVar8);
    if ((rect->bounds_[0].bounds_.c_[0] <= dVar8) && (dVar8 <= rect->bounds_[0].bounds_.c_[1]))
    goto LAB_0024292b;
    dVar8 = S2::SiTitoST(iVar7 + this->ij_lo_[1] * 2);
    dVar8 = S2::STtoUV(dVar8);
    if ((rect->bounds_[1].bounds_.c_[0] <= dVar8) && (dVar8 <= rect->bounds_[1].bounds_.c_[1]))
    goto LAB_0024292b;
  }
  R2Rect::Expanded(&padded,rect,this->padding_ + 3.3306690738754696e-16);
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
    dVar8 = S2::UVtoST(*(double *)((long)padded.bounds_[0].bounds_.c_ + lVar6 * 4));
    uVar4 = (uint)ROUND(dVar8 * 1073741824.0 + -0.5);
    if (0x3ffffffe < (int)uVar4) {
      uVar4 = 0x3fffffff;
    }
    uVar5 = *(uint *)((long)this->ij_lo_ + lVar6);
    if ((int)uVar4 <= (int)uVar5) {
      uVar4 = uVar5;
    }
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    *(uint *)((long)ij_min + lVar6) = uVar4;
    dVar8 = S2::UVtoST(*(double *)((long)padded.bounds_[0].bounds_.c_ + lVar6 * 4 + 8));
    uVar2 = (uint)ROUND(dVar8 * 1073741824.0 + -0.5);
    if (0x3ffffffe < (int)uVar2) {
      uVar2 = 0x3fffffff;
    }
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar5 = uVar5 + iVar7 + -1;
    if ((int)uVar5 <= (int)uVar2) {
      uVar2 = uVar5;
    }
    *(uint *)((long)ij_xor + lVar6) = uVar2 ^ uVar4;
  }
  uVar4 = (ij_xor[1] | ij_xor[0]) * 2 + 1;
  uVar5 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  iVar7 = (uVar5 ^ 0x1f) - 1;
  if (this->level_ < iVar7) {
    local_58 = S2CellId::FromFaceIJ((uint)((this->id_).id_ >> 0x3d),ij_min[0],ij_min[1]);
    SVar3 = S2CellId::parent(&local_58,iVar7);
    return (S2CellId)SVar3.id_;
  }
LAB_0024292b:
  return (S2CellId)(this->id_).id_;
}

Assistant:

S2CellId S2PaddedCell::ShrinkToFit(const R2Rect& rect) const {
  S2_DCHECK(bound().Intersects(rect));

  // Quick rejection test: if "rect" contains the center of this cell along
  // either axis, then no further shrinking is possible.
  int ij_size = S2CellId::GetSizeIJ(level_);
  if (level_ == 0) {
    // Fast path (most calls to this function start with a face cell).
    if (rect[0].Contains(0) || rect[1].Contains(0)) return id();
  } else {
    if (rect[0].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[0] + ij_size))) ||
        rect[1].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[1] + ij_size)))) {
      return id();
    }
  }
  // Otherwise we expand "rect" by the given padding() on all sides and find
  // the range of coordinates that it spans along the i- and j-axes.  We then
  // compute the highest bit position at which the min and max coordinates
  // differ.  This corresponds to the first cell level at which at least two
  // children intersect "rect".

  // Increase the padding to compensate for the error in S2::UVtoST().
  // (The constant below is a provable upper bound on the additional error.)
  R2Rect padded = rect.Expanded(padding() + 1.5 * DBL_EPSILON);
  int ij_min[2];  // Min i- or j- coordinate spanned by "padded"
  int ij_xor[2];  // XOR of the min and max i- or j-coordinates
  for (int d = 0; d < 2; ++d) {
    ij_min[d] = max(ij_lo_[d], S2::STtoIJ(S2::UVtoST(padded[d][0])));
    int ij_max = min(ij_lo_[d] + ij_size - 1,
                     S2::STtoIJ(S2::UVtoST(padded[d][1])));
    ij_xor[d] = ij_min[d] ^ ij_max;
  }
  // Compute the highest bit position where the two i- or j-endpoints differ,
  // and then choose the cell level that includes both of these endpoints.  So
  // if both pairs of endpoints are equal we choose kMaxLevel; if they differ
  // only at bit 0, we choose (kMaxLevel - 1), and so on.
  int level_msb = ((ij_xor[0] | ij_xor[1]) << 1) + 1;
  int level = S2CellId::kMaxLevel - Bits::FindMSBSetNonZero(level_msb);
  if (level <= level_) return id();
  return S2CellId::FromFaceIJ(id().face(), ij_min[0], ij_min[1]).parent(level);
}